

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

bool Fixpp::impl::TagMatcher<Fixpp::Type::Int>::matchValue(Return *value,StreamCursor *cursor)

{
  long lVar1;
  size_t sVar2;
  size_t sVar4;
  size_t count;
  StreamBuf<char> *pSVar5;
  Return RVar6;
  long lVar3;
  
  pSVar5 = cursor->buf;
  lVar1 = *(long *)&pSVar5->field_0x10;
  lVar3 = *(long *)&pSVar5->field_0x18;
  if (lVar3 == lVar1) {
    lVar1 = (**(code **)(*(long *)pSVar5 + 0x38))();
    if (lVar1 == 0) {
      return false;
    }
    pSVar5 = cursor->buf;
    lVar1 = *(long *)&pSVar5->field_0x10;
    lVar3 = *(long *)&pSVar5->field_0x18;
  }
  sVar2 = lVar3 - lVar1;
  if (sVar2 == 0) {
    sVar2 = (**(code **)(*(long *)pSVar5 + 0x38))();
  }
  sVar4 = 0;
  RVar6 = 0;
  do {
    count = sVar4;
    if (9 < (byte)(*(byte *)(lVar1 + sVar4) - 0x30)) break;
    RVar6 = (uint)*(byte *)(lVar1 + sVar4) + RVar6 * 10 + -0x30;
    sVar4 = sVar4 + 1;
    count = sVar2;
  } while (sVar2 != sVar4);
  if (count == 0) {
    return false;
  }
  StreamCursor::advance(cursor,count);
  *value = RVar6;
  return true;
}

Assistant:

static bool matchValue(Return* value, StreamCursor& cursor)
            {
                int val;
                if (!match_int_fast(&val, cursor)) return false;

                *value = val;
                return true;
            }